

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool __thiscall
Fossilize::StateReplayer::Impl::parse_pipeline_layouts
          (Impl *this,StateCreatorInterface *iface,Value *layouts)

{
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_00;
  size_t size;
  ulonglong uVar1;
  undefined8 uVar2;
  bool bVar3;
  byte bVar4;
  ulong uVar5;
  ConstMemberIterator CVar6;
  Ch *__nptr;
  size_type sVar7;
  Type pGVar8;
  Number NVar9;
  mapped_type *ppVVar10;
  void *pvVar11;
  Pointer this_01;
  bool bVar12;
  Hash hash;
  ulonglong local_60;
  Data local_58;
  void *local_48;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkPipelineLayout_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkPipelineLayout_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_40;
  Value *local_38;
  
  local_58.o.members = (Member *)iface;
  if ((layouts->data_).f.flags != 3) {
    __assert_fail("IsObject()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                  ,0x49a,
                  "SizeType rapidjson::GenericValue<rapidjson::UTF8<>>::MemberCount() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                 );
  }
  uVar5 = (ulong)(layouts->data_).s.length;
  if (uVar5 == 0) {
    local_48 = (void *)0x0;
  }
  else {
    size = uVar5 * 0x30;
    local_48 = ScratchAllocator::allocate_raw(&this->allocator,size,0x10);
    if (local_48 != (void *)0x0) {
      memset(local_48,0,size);
    }
  }
  if ((layouts->data_).f.flags != 3) {
    __assert_fail("IsObject()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                  ,0x4d8,
                  "ConstMemberIterator rapidjson::GenericValue<rapidjson::UTF8<>>::MemberBegin() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                 );
  }
  this_01 = (Pointer)((ulong)(layouts->data_).s.str & 0xffffffffffff);
  CVar6 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::MemberEnd(layouts);
  bVar12 = CVar6.ptr_ == this_01;
  if (!bVar12) {
    local_40 = &(this->replayed_pipeline_layouts)._M_h;
    uVar5 = 0;
    local_38 = layouts;
    do {
      __nptr = rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::GetString(&this_01->name);
      local_60 = strtoull(__nptr,(char **)0x0,0x10);
      sVar7 = std::
              _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkPipelineLayout_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkPipelineLayout_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::count(local_40,&local_60);
      pvVar11 = local_48;
      bVar4 = 0;
      if (sVar7 == 0) {
        this_00 = &this_01->value;
        *(undefined4 *)((long)local_48 + uVar5 * 0x30) = 0x1e;
        pGVar8 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)this_00,"flags");
        if ((undefined1  [16])((undefined1  [16])pGVar8->data_ & (undefined1  [16])0x40000000000000)
            == (undefined1  [16])0x0) {
          __assert_fail("data_.f.flags & kUintFlag",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                        ,0x719,
                        "unsigned int rapidjson::GenericValue<rapidjson::UTF8<>>::GetUint() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                       );
        }
        pvVar11 = (void *)(uVar5 * 0x30 + (long)pvVar11);
        *(SizeType *)((long)pvVar11 + 0x10) = (pGVar8->data_).s.length;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&local_58.s,(Ch *)this_00);
        uVar2 = local_58.n;
        NVar9.i = (I)rapidjson::
                     GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     ::MemberEnd(this_00);
        if (uVar2 != NVar9.i64) {
          pGVar8 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   ::operator[]<char_const>
                             ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                               *)this_00,"pushConstantRanges");
          if ((pGVar8->data_).f.flags != 4) goto LAB_0011cb85;
          *(SizeType *)((long)pvVar11 + 0x20) = (pGVar8->data_).s.length;
          pGVar8 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   ::operator[]<char_const>
                             ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                               *)this_00,"pushConstantRanges");
          parse_push_constant_ranges(this,pGVar8,(VkPushConstantRange **)((long)pvVar11 + 0x28));
        }
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&local_58.s,(Ch *)this_00);
        uVar2 = local_58.n;
        NVar9.i = (I)rapidjson::
                     GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     ::MemberEnd(this_00);
        if (uVar2 != NVar9.i64) {
          pGVar8 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   ::operator[]<char_const>
                             ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                               *)this_00,"setLayouts");
          if ((pGVar8->data_).f.flags != 4) {
LAB_0011cb85:
            __assert_fail("IsArray()",
                          "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                          ,0x66a,
                          "SizeType rapidjson::GenericValue<rapidjson::UTF8<>>::Size() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                         );
          }
          *(SizeType *)((long)pvVar11 + 0x14) = (pGVar8->data_).s.length;
          pGVar8 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   ::operator[]<char_const>
                             ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                               *)this_00,"setLayouts");
          bVar3 = parse_set_layouts(this,pGVar8,(VkDescriptorSetLayout **)((long)pvVar11 + 0x18));
          bVar4 = 1;
          layouts = local_38;
          if (!bVar3) goto LAB_0011cb41;
        }
        uVar1 = local_60;
        ppVVar10 = std::__detail::
                   _Map_base<unsigned_long,_std::pair<const_unsigned_long,_VkPipelineLayout_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkPipelineLayout_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_VkPipelineLayout_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkPipelineLayout_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)local_40,&local_60);
        bVar4 = (**(code **)(*(long *)local_58.s.str + 0x38))(local_58.s.str,uVar1,pvVar11,ppVVar10)
        ;
        bVar4 = bVar4 ^ 1;
      }
LAB_0011cb41:
      if ((bVar4 & 3) != 0) {
        return bVar12;
      }
      this_01 = this_01 + 1;
      uVar5 = (ulong)((int)uVar5 + 1);
      CVar6 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::MemberEnd(layouts);
      bVar12 = this_01 == CVar6.ptr_;
    } while (!bVar12);
  }
  (**(code **)(*(long *)local_58.s.str + 0x88))();
  return bVar12;
}

Assistant:

bool StateReplayer::Impl::parse_pipeline_layouts(StateCreatorInterface &iface, const Value &layouts)
{
	auto *infos = allocator.allocate_n_cleared<VkPipelineLayoutCreateInfo>(layouts.MemberCount());

	unsigned index = 0;
	for (auto itr = layouts.MemberBegin(); itr != layouts.MemberEnd(); ++itr, index++)
	{
		Hash hash = string_to_uint64(itr->name.GetString());
		if (replayed_pipeline_layouts.count(hash))
			continue;
		auto &obj = itr->value;
		auto &info = infos[index];
		info.sType = VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO;

		info.flags = obj["flags"].GetUint();

		if (obj.HasMember("pushConstantRanges"))
		{
			info.pushConstantRangeCount = obj["pushConstantRanges"].Size();
			if (!parse_push_constant_ranges(obj["pushConstantRanges"], &info.pPushConstantRanges))
				return false;
		}

		if (obj.HasMember("setLayouts"))
		{
			info.setLayoutCount = obj["setLayouts"].Size();
			if (!parse_set_layouts(obj["setLayouts"], &info.pSetLayouts))
				return false;
		}

		if (!iface.enqueue_create_pipeline_layout(hash, &info, &replayed_pipeline_layouts[hash]))
			return false;
	}

	iface.notify_replayed_resources_for_type();
	return true;
}